

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::cMove(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Char value;
  uint uVar1;
  uint index;
  uint index_00;
  bool bVar2;
  
  requireDStackDepth(this,3,"CMOVE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  index_00 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    value = dataSpaceAt(this,index_00);
    dataSpaceSet(this,index,value);
    index = index + 1;
    index_00 = index_00 + 1;
  }
  return;
}

Assistant:

void cMove() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(dst + i, dataSpaceAt(src + i));
			}
		}